

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O1

void lyplg_ext_print_info_extension_instance(lyspr_ctx *ctx,lysc_ext_instance *ext,ly_bool *flag)

{
  lysc_ext_substmt *plVar1;
  lysc_ident *plVar2;
  ly_out *plVar3;
  lysc_pattern *plVar4;
  lysc_must *plVar5;
  bool bVar6;
  void **ppvVar7;
  ulong uVar8;
  lysc_ext_instance *plVar9;
  char *text;
  void *exts;
  uint8_t substmt_index;
  LY_DATA_TYPE basetype;
  ly_stmt lVar10;
  lysc_range *range;
  char *in_R8;
  lysc_ext_instance *in_R9;
  void **ppvVar11;
  lysc_ident *ident;
  lysc_node_action *action;
  lysc_pattern *pattern;
  lysc_must *must;
  ulong uVar12;
  lysc_ext_instance *plVar13;
  
  bVar6 = false;
  ppvVar11 = (void **)0x0;
  do {
    plVar1 = ext->substmts;
    if (plVar1 == (lysc_ext_substmt *)0x0) {
      ppvVar7 = (void **)0x0;
    }
    else {
      ppvVar7 = plVar1[-1].storage_p;
    }
    if (ppvVar7 <= ppvVar11) {
      return;
    }
    lVar10 = plVar1[(long)ppvVar11].stmt;
    if ((int)lVar10 < 0x130000) {
      if ((int)lVar10 < 0x20000) {
        if ((int)lVar10 < 0x100) {
          if ((lVar10 - LY_STMT_NOTIFICATION < 0x40) &&
             ((0x800000008000808bU >> ((ulong)(lVar10 - LY_STMT_NOTIFICATION) & 0x3f) & 1) != 0))
          goto LAB_00191369;
          if (lVar10 == LY_STMT_AUGMENT) goto LAB_00191985;
          goto LAB_00191843;
        }
        if ((int)lVar10 < 0x1000) {
          if ((int)lVar10 < 0x400) {
            if ((lVar10 == LY_STMT_CASE) || (lVar10 == LY_STMT_CHOICE)) goto LAB_00191369;
          }
          else {
            if (lVar10 == LY_STMT_CONTAINER) goto LAB_00191369;
            if (lVar10 == LY_STMT_GROUPING) goto LAB_00191985;
          }
        }
        else if ((int)lVar10 < 0x4000) {
          if ((lVar10 == LY_STMT_LEAF) || (lVar10 == LY_STMT_LEAF_LIST)) goto LAB_00191369;
        }
        else {
          if ((lVar10 == LY_STMT_LIST) || (lVar10 == LY_STMT_USES)) {
LAB_00191369:
            if (!bVar6) {
              for (action = (lysc_node_action *)*plVar1[(long)ppvVar11].storage_p;
                  action != (lysc_node_action *)0x0;
                  action = (lysc_node_action *)(action->field_0).node.next) {
                if ((flag != (ly_bool *)0x0) && (*flag == '\0')) {
                  plVar3 = ctx->out;
                  *flag = '\x01';
                  ly_print_(plVar3," {\n");
                }
                lVar10 = ext->substmts[(long)ppvVar11].stmt;
                if (lVar10 == LY_STMT_NOTIFICATION) {
                  yprc_notification((lys_ypr_ctx *)ctx,(lysc_node_notif *)action);
                }
                else if ((lVar10 & (LY_STMT_OUTPUT|LY_STMT_INPUT)) == LY_STMT_NONE) {
                  if ((lVar10 & (LY_STMT_RPC|LY_STMT_ACTION)) == LY_STMT_NONE) {
                    yprc_node((lys_ypr_ctx *)ctx,(lysc_node *)action);
                  }
                  else {
                    yprc_action((lys_ypr_ctx *)ctx,action);
                  }
                }
                else {
                  yprc_inout((lys_ypr_ctx *)ctx,(lysc_node_action_inout *)action,flag);
                }
              }
            }
            bVar6 = true;
            goto LAB_00191985;
          }
          if (lVar10 == LY_STMT_ARGUMENT) goto LAB_001917be;
        }
        goto LAB_00191843;
      }
      if ((int)lVar10 < 0xa0000) {
        if ((int)lVar10 < 0x60000) {
          if ((int)lVar10 < 0x40000) {
            if ((lVar10 != LY_STMT_BASE) && (lVar10 != LY_STMT_BELONGS_TO)) goto LAB_00191843;
          }
          else if (lVar10 == LY_STMT_BIT) {
LAB_00191810:
            yprc_bits_enum((lys_ypr_ctx *)ctx,
                           (lysc_type_bitenum_item *)*plVar1[(long)ppvVar11].storage_p,
                           (uint)(lVar10 != LY_STMT_BIT) * 4 + LY_TYPE_BITS,flag);
          }
          else {
            if (lVar10 != LY_STMT_CONFIG) goto LAB_00191843;
            ypr_config((lys_ypr_ctx *)ctx,*(uint16_t *)plVar1[(long)ppvVar11].storage_p,ext->exts,
                       flag);
          }
        }
        else if ((int)lVar10 < 0x80000) {
          if (lVar10 == LY_STMT_CONTACT) goto LAB_001917be;
          if (lVar10 != LY_STMT_DEFAULT) goto LAB_00191843;
        }
        else {
          if (lVar10 == LY_STMT_DESCRIPTION) goto LAB_001917be;
          if (lVar10 != LY_STMT_DEVIATE) goto LAB_00191843;
        }
      }
      else if ((int)lVar10 < 0xe0000) {
        if ((int)lVar10 < 0xc0000) {
          if (lVar10 == LY_STMT_DEVIATION) goto LAB_00191985;
          if (lVar10 == LY_STMT_ENUM) goto LAB_00191810;
        }
        else if ((lVar10 == LY_STMT_ERROR_APP_TAG) || (lVar10 == LY_STMT_ERROR_MESSAGE))
        goto LAB_001917be;
LAB_00191843:
        in_R8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_yang.c";
        in_R9 = (lysc_ext_instance *)0xaa8;
        ly_log(ctx->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).");
      }
      else if ((int)lVar10 < 0x100000) {
        if (lVar10 != LY_STMT_EXTENSION) {
          if (lVar10 != LY_STMT_EXTENSION_INSTANCE) goto LAB_00191843;
          in_R8 = (char *)flag;
          yprc_extension_instances
                    ((lys_ypr_ctx *)ctx,LY_STMT_EXTENSION_INSTANCE,'\0',
                     (lysc_ext_instance *)*plVar1[(long)ppvVar11].storage_p,flag);
        }
      }
      else if (lVar10 != LY_STMT_FEATURE) {
        if (lVar10 == LY_STMT_FRACTION_DIGITS) {
          exts = *plVar1[(long)ppvVar11].storage_p;
          if (exts != (void *)0x0) {
            substmt_index = (uint8_t)ext->exts;
            lVar10 = LY_STMT_FRACTION_DIGITS;
            goto LAB_0019197d;
          }
        }
        else {
          if (lVar10 != LY_STMT_IDENTITY) goto LAB_00191843;
          plVar2 = (lysc_ident *)*plVar1[(long)ppvVar11].storage_p;
          uVar12 = 0;
          ident = plVar2;
          while( true ) {
            if (plVar2 == (lysc_ident *)0x0) {
              uVar8 = 0;
            }
            else {
              uVar8 = *(ulong *)&plVar2[-1].flags;
            }
            if (uVar8 <= uVar12) break;
            yprc_identity((lys_ypr_ctx *)ctx,ident);
            uVar12 = uVar12 + 1;
            ident = ident + 1;
          }
        }
      }
    }
    else if ((int)lVar10 < 0x240000) {
      if ((int)lVar10 < 0x1b0000) {
        if ((int)lVar10 < 0x170000) {
          if ((int)lVar10 < 0x150000) {
            if ((lVar10 != LY_STMT_IF_FEATURE) && (lVar10 != LY_STMT_IMPORT)) goto LAB_00191843;
          }
          else if (lVar10 != LY_STMT_INCLUDE) {
            if (lVar10 == LY_STMT_KEY) goto LAB_001917be;
            goto LAB_00191843;
          }
        }
        else if ((int)lVar10 < 0x190000) {
          if (lVar10 == LY_STMT_LENGTH) {
            range = (lysc_range *)*plVar1[(long)ppvVar11].storage_p;
            if (range != (lysc_range *)0x0) {
              basetype = LY_TYPE_STRING;
              goto LAB_0019195c;
            }
          }
          else {
            if (lVar10 != LY_STMT_MANDATORY) goto LAB_00191843;
            ypr_mandatory((lys_ypr_ctx *)ctx,*(uint16_t *)plVar1[(long)ppvVar11].storage_p,ext->exts
                          ,flag);
          }
        }
        else {
          if (lVar10 == LY_STMT_MAX_ELEMENTS) {
            exts = (void *)(ulong)*(uint *)plVar1[(long)ppvVar11].storage_p;
            if (exts == (void *)0x0) {
              if ((flag != (ly_bool *)0x0) && (*flag == '\0')) {
                plVar3 = ctx->out;
                *flag = '\x01';
                ly_print_(plVar3," {\n");
              }
              in_R9 = ext->exts;
              lVar10 = LY_STMT_MAX_ELEMENTS;
              text = "unbounded";
              goto LAB_00191803;
            }
            substmt_index = (uint8_t)ext->exts;
            lVar10 = LY_STMT_MAX_ELEMENTS;
          }
          else {
            if (lVar10 != LY_STMT_MIN_ELEMENTS) goto LAB_00191843;
            substmt_index = (uint8_t)ext->exts;
            exts = (void *)(ulong)*(uint *)plVar1[(long)ppvVar11].storage_p;
            lVar10 = LY_STMT_MIN_ELEMENTS;
          }
LAB_0019197d:
          in_R8 = (char *)flag;
          ypr_unsigned((lys_ypr_ctx *)ctx,lVar10,substmt_index,exts,(unsigned_long)flag,
                       (ly_bool *)in_R9);
        }
      }
      else if ((int)lVar10 < 0x1f0000) {
        if ((int)lVar10 < 0x1d0000) {
          if (lVar10 == LY_STMT_MODIFIER) {
LAB_001917be:
            if (*plVar1[(long)ppvVar11].storage_p != (void *)0x0) {
              if ((flag != (ly_bool *)0x0) && (*flag == '\0')) {
                plVar3 = ctx->out;
                *flag = '\x01';
                ly_print_(plVar3," {\n");
              }
              in_R9 = ext->exts;
              lVar10 = ext->substmts[(long)ppvVar11].stmt;
              text = (char *)*ext->substmts[(long)ppvVar11].storage_p;
              goto LAB_00191803;
            }
          }
          else if (lVar10 != LY_STMT_MODULE) goto LAB_00191843;
        }
        else {
          if (lVar10 != LY_STMT_MUST) {
            if (lVar10 != LY_STMT_NAMESPACE) goto LAB_00191843;
            goto LAB_001917be;
          }
          plVar5 = (lysc_must *)*plVar1[(long)ppvVar11].storage_p;
          plVar13 = (lysc_ext_instance *)0x0;
          must = plVar5;
          while( true ) {
            if (plVar5 == (lysc_must *)0x0) {
              plVar9 = (lysc_ext_instance *)0x0;
            }
            else {
              plVar9 = plVar5[-1].exts;
            }
            if (plVar9 <= plVar13) break;
            yprc_must((lys_ypr_ctx *)ctx,must,flag);
            plVar13 = (lysc_ext_instance *)((long)&plVar13->def + 1);
            must = must + 1;
          }
        }
      }
      else {
        if (0x20ffff < (int)lVar10) {
          if (lVar10 != LY_STMT_PATH) {
            if (lVar10 == LY_STMT_PATTERN) {
              plVar4 = (lysc_pattern *)*plVar1[(long)ppvVar11].storage_p;
              uVar12 = 0;
              pattern = plVar4;
              while( true ) {
                if (plVar4 == (lysc_pattern *)0x0) {
                  uVar8 = 0;
                }
                else {
                  uVar8 = *(ulong *)&plVar4[-1].field_0x38;
                }
                if (uVar8 <= uVar12) break;
                yprc_pattern((lys_ypr_ctx *)ctx,pattern,flag);
                uVar12 = uVar12 + 1;
                pattern = pattern + 1;
              }
            }
            else {
              if (lVar10 != LY_STMT_POSITION) goto LAB_00191843;
              if (*plVar1[(long)ppvVar11].storage_p != (void *)0x0) {
                substmt_index = (uint8_t)ext->exts;
                exts = *plVar1[(long)ppvVar11].storage_p;
                lVar10 = LY_STMT_POSITION;
                goto LAB_0019197d;
              }
            }
          }
          goto LAB_00191985;
        }
        if (lVar10 != LY_STMT_ORDERED_BY) {
          if (lVar10 != LY_STMT_ORGANIZATION) goto LAB_00191843;
          goto LAB_001917be;
        }
        if ((flag != (ly_bool *)0x0) && (*flag == '\0')) {
          plVar3 = ctx->out;
          *flag = '\x01';
          ly_print_(plVar3," {\n");
        }
        in_R9 = ext->exts;
        text = "user";
        if (((ulong)*ext->substmts[(long)ppvVar11].storage_p & 0x40) == 0) {
          text = "system";
        }
        lVar10 = LY_STMT_ORDERED_BY;
LAB_00191803:
        in_R8 = (char *)0x0;
        ypr_substmt((lys_ypr_ctx *)ctx,lVar10,'\0',text,'\0',in_R9);
      }
    }
    else if ((int)lVar10 < 0x2d0000) {
      if ((int)lVar10 < 0x280000) {
        if ((int)lVar10 < 0x260000) {
          if (lVar10 != LY_STMT_PREFIX) {
            if (lVar10 == LY_STMT_PRESENCE) goto LAB_001917be;
            goto LAB_00191843;
          }
        }
        else {
          if (lVar10 != LY_STMT_RANGE) {
            if (lVar10 == LY_STMT_REFERENCE) goto LAB_001917be;
            goto LAB_00191843;
          }
          range = (lysc_range *)*plVar1[(long)ppvVar11].storage_p;
          if (range != (lysc_range *)0x0) {
            basetype = LY_TYPE_UINT64;
LAB_0019195c:
            yprc_range((lys_ypr_ctx *)ctx,range,basetype,flag);
          }
        }
      }
      else if ((int)lVar10 < 0x2a0000) {
        if (lVar10 != LY_STMT_REFINE) {
          if (lVar10 == LY_STMT_REQUIRE_INSTANCE) {
            if ((flag != (ly_bool *)0x0) && (*flag == '\0')) {
              plVar3 = ctx->out;
              *flag = '\x01';
              ly_print_(plVar3," {\n");
            }
            in_R9 = ext->exts;
            text = "true";
            if (*(char *)ext->substmts[(long)ppvVar11].storage_p == '\0') {
              text = "false";
            }
            lVar10 = LY_STMT_REQUIRE_INSTANCE;
            goto LAB_00191803;
          }
          goto LAB_00191843;
        }
      }
      else if ((lVar10 != LY_STMT_REVISION) && (lVar10 != LY_STMT_REVISION_DATE)) {
        if (lVar10 != LY_STMT_STATUS) goto LAB_00191843;
        ypr_status((lys_ypr_ctx *)ctx,*(uint16_t *)plVar1[(long)ppvVar11].storage_p,ext->exts,flag);
      }
    }
    else if ((int)lVar10 < 0x310000) {
      if ((int)lVar10 < 0x2f0000) {
        if (lVar10 != LY_STMT_SUBMODULE) {
          if (lVar10 != LY_STMT_TYPE) goto LAB_00191843;
          if (*plVar1[(long)ppvVar11].storage_p != (void *)0x0) {
            if ((flag != (ly_bool *)0x0) && (*flag == '\0')) {
              plVar3 = ctx->out;
              *flag = '\x01';
              ly_print_(plVar3," {\n");
            }
            yprc_type((lys_ypr_ctx *)ctx,(lysc_type *)*ext->substmts[(long)ppvVar11].storage_p);
          }
        }
      }
      else if ((lVar10 != LY_STMT_TYPEDEF) && (lVar10 != LY_STMT_UNIQUE)) goto LAB_00191843;
    }
    else if ((int)lVar10 < 0x330000) {
      if (lVar10 == LY_STMT_UNITS) goto LAB_001917be;
      if (lVar10 != LY_STMT_VALUE) goto LAB_00191843;
      if (*plVar1[(long)ppvVar11].storage_p != (void *)0x0) {
        ypr_signed((lys_ypr_ctx *)ctx,(ly_stmt)ext->exts,(uint8_t)*plVar1[(long)ppvVar11].storage_p,
                   flag,(long)in_R8,(ly_bool *)in_R9);
      }
    }
    else if (lVar10 == LY_STMT_WHEN) {
      yprc_when((lys_ypr_ctx *)ctx,(lysc_when *)*plVar1[(long)ppvVar11].storage_p,flag);
    }
    else if ((lVar10 != LY_STMT_YANG_VERSION) && (lVar10 != LY_STMT_YIN_ELEMENT)) goto LAB_00191843;
LAB_00191985:
    ppvVar11 = (void **)((long)ppvVar11 + 1);
  } while( true );
}

Assistant:

LIBYANG_API_DEF void
lyplg_ext_print_info_extension_instance(struct lyspr_ctx *ctx, const struct lysc_ext_instance *ext, ly_bool *flag)
{
    struct lys_ypr_ctx *pctx = (struct lys_ypr_ctx *)ctx;
    LY_ARRAY_COUNT_TYPE u, v;
    ly_bool data_printed = 0;

    LY_ARRAY_FOR(ext->substmts, u) {
        switch (ext->substmts[u].stmt) {
        case LY_STMT_NOTIFICATION:
        case LY_STMT_INPUT:
        case LY_STMT_OUTPUT:
        case LY_STMT_ACTION:
        case LY_STMT_RPC:
        case LY_STMT_ANYDATA:
        case LY_STMT_ANYXML:
        case LY_STMT_CASE:
        case LY_STMT_CHOICE:
        case LY_STMT_CONTAINER:
        case LY_STMT_LEAF:
        case LY_STMT_LEAF_LIST:
        case LY_STMT_LIST:
        case LY_STMT_USES: {
            const struct lysc_node *node;

            if (data_printed) {
                break;
            }

            LY_LIST_FOR(*ext->substmts[u].storage_p, node) {
                ypr_open(pctx->out, flag);
                if (ext->substmts[u].stmt == LY_STMT_NOTIFICATION) {
                    yprc_notification(pctx, (struct lysc_node_notif *)node);
                } else if (ext->substmts[u].stmt & (LY_STMT_INPUT | LY_STMT_OUTPUT)) {
                    yprc_inout(pctx, (struct lysc_node_action_inout *)node, flag);
                } else if (ext->substmts[u].stmt & (LY_STMT_ACTION | LY_STMT_RPC)) {
                    yprc_action(pctx, (struct lysc_node_action *)node);
                } else {
                    yprc_node(pctx, node);
                }
            }

            /* all data nodes are stored in a linked list so all were printed */
            data_printed = 1;
            break;
        }
        case LY_STMT_ARGUMENT:
        case LY_STMT_CONTACT:
        case LY_STMT_DESCRIPTION:
        case LY_STMT_ERROR_APP_TAG:
        case LY_STMT_ERROR_MESSAGE:
        case LY_STMT_KEY:
        case LY_STMT_MODIFIER:
        case LY_STMT_NAMESPACE:
        case LY_STMT_ORGANIZATION:
        case LY_STMT_PRESENCE:
        case LY_STMT_REFERENCE:
        case LY_STMT_UNITS:
            if (*ext->substmts[u].storage_p) {
                ypr_open(pctx->out, flag);
                ypr_substmt(pctx, ext->substmts[u].stmt, 0, *ext->substmts[u].storage_p, 0, ext->exts);
            }
            break;
        case LY_STMT_BIT:
        case LY_STMT_ENUM: {
            const struct lysc_type_bitenum_item *items = *ext->substmts[u].storage_p;

            yprc_bits_enum(pctx, items, ext->substmts[u].stmt == LY_STMT_BIT ? LY_TYPE_BITS : LY_TYPE_ENUM, flag);
            break;
        }
        case LY_STMT_CONFIG:
            ypr_config(pctx, *(uint16_t *)ext->substmts[u].storage_p, ext->exts, flag);
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            yprc_extension_instances(pctx, LY_STMT_EXTENSION_INSTANCE, 0, *ext->substmts[u].storage_p, flag);
            break;
        case LY_STMT_FRACTION_DIGITS:
            if (*ext->substmts[u].storage_p) {
                ypr_unsigned(pctx, LY_STMT_FRACTION_DIGITS, 0, ext->exts,
                        (long unsigned int)*ext->substmts[u].storage_p, flag);
            }
            break;
        case LY_STMT_IDENTITY: {
            const struct lysc_ident *idents = *ext->substmts[u].storage_p;

            LY_ARRAY_FOR(idents, v) {
                yprc_identity(pctx, &idents[v]);
            }
            break;
        }
        case LY_STMT_LENGTH:
            if (*ext->substmts[u].storage_p) {
                yprc_range(pctx, *ext->substmts[u].storage_p, LY_TYPE_STRING, flag);
            }
            break;
        case LY_STMT_MANDATORY:
            ypr_mandatory(pctx, *(uint16_t *)ext->substmts[u].storage_p, ext->exts, flag);
            break;
        case LY_STMT_MAX_ELEMENTS: {
            uint32_t max = *(uint32_t *)ext->substmts[u].storage_p;

            if (max) {
                ypr_unsigned(pctx, LY_STMT_MAX_ELEMENTS, 0, ext->exts, max, flag);
            } else {
                ypr_open(pctx->out, flag);
                ypr_substmt(pctx, LY_STMT_MAX_ELEMENTS, 0, "unbounded", 0, ext->exts);
            }
            break;
        }
        case LY_STMT_MIN_ELEMENTS:
            ypr_unsigned(pctx, LY_STMT_MIN_ELEMENTS, 0, ext->exts, *(uint32_t *)ext->substmts[u].storage_p, flag);
            break;
        case LY_STMT_ORDERED_BY:
            ypr_open(pctx->out, flag);
            ypr_substmt(pctx, LY_STMT_ORDERED_BY, 0,
                    ((*(uint16_t *)ext->substmts[u].storage_p) & LYS_ORDBY_USER) ? "user" : "system", 0, ext->exts);
            break;
        case LY_STMT_MUST: {
            const struct lysc_must *musts = *ext->substmts[u].storage_p;

            LY_ARRAY_FOR(musts, v) {
                yprc_must(pctx, &musts[v], flag);
            }
            break;
        }
        case LY_STMT_PATTERN: {
            const struct lysc_pattern *patterns = *ext->substmts[u].storage_p;

            LY_ARRAY_FOR(patterns, v) {
                yprc_pattern(pctx, &patterns[v], flag);
            }
            break;
        }
        case LY_STMT_POSITION:
            if (*ext->substmts[u].storage_p) {
                ypr_unsigned(pctx, ext->substmts[u].stmt, 0, ext->exts, *(int64_t *)ext->substmts[u].storage_p, flag);
            }
            break;
        case LY_STMT_VALUE:
            if (*ext->substmts[u].storage_p) {
                ypr_signed(pctx, ext->substmts[u].stmt, 0, ext->exts, *(int64_t *)ext->substmts[u].storage_p, flag);
            }
            break;
        case LY_STMT_RANGE:
            if (*ext->substmts[u].storage_p) {
                yprc_range(pctx, *ext->substmts[u].storage_p, LY_TYPE_UINT64, flag);
            }
            break;
        case LY_STMT_REQUIRE_INSTANCE:
            ypr_open(pctx->out, flag);
            ypr_substmt(pctx, LY_STMT_REQUIRE_INSTANCE, 0, *(uint8_t *)ext->substmts[u].storage_p ? "true" : "false",
                    0, ext->exts);
            break;
        case LY_STMT_STATUS:
            ypr_status(pctx, *(uint16_t *)ext->substmts[u].storage_p, ext->exts, flag);
            break;
        case LY_STMT_TYPE:
            if (*ext->substmts[u].storage_p) {
                ypr_open(pctx->out, flag);
                yprc_type(pctx, *ext->substmts[u].storage_p);
            }
            break;
        case LY_STMT_WHEN:
            yprc_when(pctx, *ext->substmts[u].storage_p, flag);
            break;
        case LY_STMT_AUGMENT:
        case LY_STMT_BASE:
        case LY_STMT_BELONGS_TO:
        case LY_STMT_DEFAULT:
        case LY_STMT_DEVIATE:
        case LY_STMT_DEVIATION:
        case LY_STMT_EXTENSION:
        case LY_STMT_FEATURE:
        case LY_STMT_GROUPING:
        case LY_STMT_IF_FEATURE:
        case LY_STMT_IMPORT:
        case LY_STMT_INCLUDE:
        case LY_STMT_MODULE:
        case LY_STMT_PATH:
        case LY_STMT_PREFIX:
        case LY_STMT_REFINE:
        case LY_STMT_REVISION:
        case LY_STMT_REVISION_DATE:
        case LY_STMT_SUBMODULE:
        case LY_STMT_TYPEDEF:
        case LY_STMT_UNIQUE:
        case LY_STMT_YANG_VERSION:
        case LY_STMT_YIN_ELEMENT:
            /* nothing to do */
            break;
        default:
            LOGINT(pctx->module->ctx);
            break;
        }
    }
}